

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O3

ptr<buffer> __thiscall nuraft::force_vote_msg::serialize(force_vote_msg *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<buffer> pVar1;
  buffer_serializer bs;
  buffer_serializer bStack_28;
  
  buffer::alloc((buffer *)this,1);
  buffer_serializer::buffer_serializer(&bStack_28,(ptr<buffer> *)this,LITTLE);
  buffer_serializer::put_u8(&bStack_28,'\0');
  pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (ptr<buffer>)pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<buffer> force_vote_msg::serialize() const {
    //   << Format >>
    // version                      1 byte
    // ... to be added ...

    size_t len = sizeof(uint8_t);
    ptr<buffer> ret = buffer::alloc(len);

    const uint8_t CURRENT_VERSION = 0x0;
    buffer_serializer bs(ret);
    bs.put_u8(CURRENT_VERSION);
    return ret;
}